

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O2

void validate_primal_solution
               (Instance *instance,Solution *solution,int32_t min_num_customers_served)

{
  Tour *tour;
  int iVar1;
  uint __line;
  int32_t *piVar2;
  int32_t i;
  int iVar3;
  char *__assertion;
  long lVar4;
  ulong uVar5;
  double dVar6;
  double local_48;
  double dStack_40;
  double local_38;
  
  tour = &solution->tour;
  validate_tour(instance,tour,min_num_customers_served);
  dVar6 = (solution->primal_bound - solution->dual_bound) / (ABS(solution->primal_bound) + 1e-10);
  if (dVar6 <= 0.0) {
    if (1e-06 < ABS(dVar6)) {
      __assertion = "fgte(gap, 0.0, 1e-6)";
      __line = 0x34;
      goto LAB_00105eea;
    }
  }
  dVar6 = INFINITY;
  if ((solution->tour).num_comps == 1) {
    for (iVar3 = 0; iVar3 <= tour->num_customers; iVar3 = iVar3 + 1) {
      piVar2 = tsucc(tour,iVar3);
      iVar1 = *piVar2;
      if (-1 < iVar1) {
        piVar2 = tcomp(tour,iVar3);
        if ((*piVar2 != 0) || (tour->num_customers < iVar1)) {
          dVar6 = INFINITY;
          goto LAB_00105e74;
        }
      }
    }
    local_48 = *instance->profits + 0.0;
    dStack_40 = *instance->demands + 0.0;
    local_38 = 0.0;
    iVar3 = 0;
    while( true ) {
      piVar2 = tsucc(tour,iVar3);
      iVar1 = *piVar2;
      lVar4 = (long)iVar1;
      if (lVar4 == 0) break;
      if (iVar1 == iVar3) {
        __assert_fail("next_vertex != curr_vertex",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/core-utils.h"
                      ,0x80,"double tour_eval(const Instance *, Tour *)");
      }
      dVar6 = cptp_dist(instance,iVar3,iVar1);
      local_38 = local_38 + dVar6;
      local_48 = local_48 + instance->profits[lVar4];
      dStack_40 = dStack_40 + instance->demands[lVar4];
      iVar3 = iVar1;
    }
    dVar6 = cptp_dist(instance,iVar3,0);
    uVar5 = -(ulong)(instance->vehicle_cap < dStack_40);
    dVar6 = (double)(uVar5 & 0x7ff0000000000000 | ~uVar5 & (ulong)((local_38 + dVar6) - local_48));
  }
LAB_00105e74:
  if (ABS(dVar6 - solution->primal_bound) <= 1e-05) {
    return;
  }
  __assertion = "feq(obj, solution->primal_bound, 1e-5)";
  __line = 0x39;
LAB_00105eea:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/validation.c"
                ,__line,"void validate_primal_solution(const Instance *, Solution *, int32_t)");
}

Assistant:

void validate_primal_solution(const Instance *instance, Solution *solution,
                              int32_t min_num_customers_served) {
#ifndef NDEBUG

    validate_tour(instance, &solution->tour, min_num_customers_served);

    // Upper bound should be bigger than lower bound
    double gap = solution_relgap(solution);
    assert(fgte(gap, 0.0, 1e-6));

    // The recomputed objective value should be the same of what is stored
    // inside the solution
    double obj = tour_eval(instance, &solution->tour);
    assert(feq(obj, solution->primal_bound, 1e-5));

#else
    UNUSED_PARAM(instance);
    UNUSED_PARAM(solution);
    UNUSED_PARAM(min_num_customers_served);
#endif
}